

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O2

void __thiscall MemoryFootprintAllocator::fastFree(MemoryFootprintAllocator *this,void *ptr)

{
  map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  *this_00;
  mapped_type *pmVar1;
  iterator __position;
  void *local_28;
  
  local_28 = ptr;
  pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  this_00 = &this->bookkeeper;
  pmVar1 = std::
           map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
           ::operator[](this_00,&local_28);
  this->current_memory_usage = this->current_memory_usage - (int)*pmVar1;
  __position = std::
               _Rb_tree<void_*,_std::pair<void_*const,_unsigned_long>,_std::_Select1st<std::pair<void_*const,_unsigned_long>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
               ::find(&this_00->_M_t,&local_28);
  std::
  _Rb_tree<void*,std::pair<void*const,unsigned_long>,std::_Select1st<std::pair<void*const,unsigned_long>>,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>
  ::erase_abi_cxx11_((_Rb_tree<void*,std::pair<void*const,unsigned_long>,std::_Select1st<std::pair<void*const,unsigned_long>>,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>
                      *)this_00,__position);
  free(local_28);
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return;
}

Assistant:

virtual void fastFree(void* ptr)
    {
        ncnn::MutexLockGuard g(lock);
        size_t size = bookkeeper[ptr];
        current_memory_usage -= size;
        bookkeeper.erase(bookkeeper.find(ptr));
        ncnn::fastFree(ptr);
    }